

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O2

void UI::PathTracerStartButton(shared_ptr<PathTracerThread> *path_tracer_thread,char **open_modal)

{
  bool bVar1;
  
  bVar1 = ImGui::MenuItem(anon_var_dwarf_1f19d7,(char *)0x0,false,true);
  if (bVar1) {
    *open_modal = "Start PathTracer";
  }
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Start Path Tracer",(char *)0x0);
    ImGui::EndTooltip();
    return;
  }
  return;
}

Assistant:

void PathTracerStartButton(const std::shared_ptr<PathTracerThread> &path_tracer_thread, const char **open_modal) {
	if (ImGui::MenuItem(ICON_FA_PLAY)) {
		*open_modal = kPathTracerStartModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Start Path Tracer");
		ImGui::EndTooltip();
	}
}